

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::debug_logger<true>::log<int,int,long_double,long_double>
          (debug_logger<true> *this,string_view fmt,int *args,int *args_1,longdouble *args_2,
          longdouble *args_3)

{
  string_view format_str;
  format_args args_00;
  ulong local_48 [2];
  ulong local_38;
  undefined8 local_28;
  undefined2 local_20;
  undefined8 local_18;
  undefined2 local_10;
  
  local_48[0] = (ulong)(uint)*args;
  local_38 = (ulong)(uint)*args_1;
  local_28 = *(undefined8 *)args_2;
  local_18 = *(undefined8 *)args_3;
  local_20 = (undefined2)*(undefined4 *)((long)args_2 + 8);
  local_10 = (undefined2)*(undefined4 *)((long)args_3 + 8);
  format_str.size_ = fmt._M_len;
  format_str.data_ = fmt._M_str;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_48;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0xbb11;
  ::fmt::v7::vprint(this->ofs,format_str,args_00);
  return;
}

Assistant:

void log([[maybe_unused]] const std::string_view fmt,
             [[maybe_unused]] const Args&... args) const noexcept
    {
        if constexpr (debug) {
            fmt::print(ofs, fmt, args...);
        }
    }